

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecVec.h
# Opt level: O2

double Vec_VecMemoryInt(Vec_Vec_t *p)

{
  int iVar1;
  double dVar2;
  Vec_Ptr_t *pVVar3;
  Vec_Int_t *pVVar4;
  int iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  
  if (p == (Vec_Vec_t *)0x0) {
    return 0.0;
  }
  iVar5 = p->nCap;
  auVar6._8_4_ = iVar5 >> 0x1f;
  auVar6._0_8_ = (long)iVar5;
  auVar6._12_4_ = 0x45300000;
  dVar2 = ((auVar6._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,iVar5) - 4503599627370496.0)) * 8.0 + 16.0;
  for (iVar5 = 0; iVar5 < p->nSize; iVar5 = iVar5 + 1) {
    pVVar3 = Vec_VecEntry(p,iVar5);
    if (pVVar3 != (Vec_Ptr_t *)0x0) {
      pVVar4 = Vec_VecEntryInt(p,iVar5);
      if (pVVar4 == (Vec_Int_t *)0x0) {
        dVar8 = 0.0;
      }
      else {
        iVar1 = pVVar4->nCap;
        auVar7._8_4_ = iVar1 >> 0x1f;
        auVar7._0_8_ = (long)iVar1;
        auVar7._12_4_ = 0x45300000;
        dVar8 = ((auVar7._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,iVar1) - 4503599627370496.0)) * 4.0 + 16.0;
      }
      dVar2 = dVar2 + dVar8;
    }
  }
  return dVar2;
}

Assistant:

static inline double Vec_VecMemoryInt( Vec_Vec_t * p )
{
    int i;
    double Mem;
    if ( p == NULL )  return 0.0;
    Mem = Vec_PtrMemory( (Vec_Ptr_t *)p );
    for ( i = 0; i < p->nSize; i++ )
        if ( Vec_VecEntry(p, i) )
            Mem += Vec_IntMemory( Vec_VecEntryInt(p, i) );
    return Mem;
}